

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O0

QRect __thiscall QCommandLinkButtonPrivate::descriptionRect(QCommandLinkButtonPrivate *this)

{
  long lVar1;
  QCommandLinkButton *pQVar2;
  QCommandLinkButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  QCommandLinkButton *q;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QWidget *in_stack_ffffffffffffffb8;
  QCommandLinkButtonPrivate *in_stack_ffffffffffffffc0;
  QCommandLinkButtonPrivate *pQVar4;
  QRect *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  pQVar2 = q_func(in_RDI);
  QWidget::rect(in_stack_ffffffffffffffb8);
  textOffset(in_stack_ffffffffffffffc0);
  descriptionOffset((QCommandLinkButtonPrivate *)
                    CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  rightMargin(in_RDI);
  bottomMargin(in_RDI);
  QVar3 = QRect::adjusted(in_stack_ffffffffffffffd8,(int)((ulong)pQVar4 >> 0x20),(int)pQVar4,
                          (int)((ulong)pQVar2 >> 0x20),(int)pQVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QRect QCommandLinkButtonPrivate::descriptionRect() const
{
    Q_Q(const QCommandLinkButton);
    return q->rect().adjusted(textOffset(), descriptionOffset(),
                              -rightMargin(), -bottomMargin());
}